

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_diag_m(REF_DBL *m,REF_DBL *d)

{
  ulong uVar1;
  REF_DBL RVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  REF_DBL *pRVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar27;
  undefined1 auVar26 [16];
  double dVar28;
  REF_DBL local_68 [3];
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  RVar2 = *m;
  if (0x7fefffffffffffff < (ulong)ABS(RVar2)) {
    return 3;
  }
  dVar22 = m[1];
  if (0x7fefffffffffffff < (ulong)ABS(dVar22)) {
    return 3;
  }
  dVar13 = m[2];
  if (0x7fefffffffffffff < (ulong)ABS(dVar13)) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[3])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[4])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[5])) {
    return 3;
  }
  local_68[0] = SQRT(dVar22 * dVar22 + dVar13 * dVar13);
  auVar20._0_8_ = local_68[0] * 1e+20;
  auVar20._8_8_ = dVar22;
  auVar21._8_8_ = -dVar22;
  auVar21._0_8_ = -auVar20._0_8_;
  auVar21 = maxpd(auVar20,auVar21);
  if (auVar21._8_8_ < auVar21._0_8_) {
    dVar17 = dVar13;
    if (dVar13 <= -dVar13) {
      dVar17 = -dVar13;
    }
    if (dVar17 < auVar21._0_8_) {
      auVar12._8_8_ = dVar13;
      auVar12._0_8_ = dVar22;
      auVar19._8_8_ = local_68[0];
      auVar19._0_8_ = local_68[0];
      auVar21 = divpd(auVar12,auVar19);
      dVar22 = auVar21._0_8_;
      dVar13 = auVar21._8_8_;
      dVar18 = (dVar22 + dVar22) * m[4] + (m[5] - m[3]) * dVar13;
      *d = RVar2;
      dVar17 = dVar13 * dVar18;
      d[1] = m[3] + dVar17;
      d[2] = m[5] - dVar17;
      d[3] = 1.0;
      d[4] = 0.0;
      d[5] = 0.0;
      d[6] = 0.0;
      *(undefined1 (*) [16])(d + 7) = auVar21;
      d[9] = 0.0;
      d[10] = dVar13;
      d[0xb] = -dVar22;
      local_68[1] = m[4] - dVar18 * dVar22;
      goto LAB_0017259a;
    }
  }
  *d = RVar2;
  d[1] = m[3];
  d[2] = m[5];
  d[3] = 1.0;
  d[4] = 0.0;
  d[5] = 0.0;
  d[6] = 0.0;
  d[7] = 1.0;
  d[8] = 0.0;
  d[9] = 0.0;
  d[10] = 0.0;
  d[0xb] = 1.0;
  local_68[0] = m[1];
  local_68[1] = m[4];
LAB_0017259a:
  local_68[2] = 0.0;
  iVar5 = 0;
  local_48 = 0.0;
  dVar13 = 0.0;
  dVar17 = 0.0;
  dVar22 = 0.0;
  uVar6 = 0;
  do {
    if (uVar6 == 3) {
      return 0;
    }
    dVar18 = d[uVar6];
    dVar14 = dVar18;
    if (dVar18 <= -dVar18) {
      dVar14 = -dVar18;
    }
    dVar24 = local_68[uVar6];
    dVar23 = dVar24;
    if (dVar24 <= -dVar24) {
      dVar23 = -dVar24;
    }
    uVar3 = uVar6;
    dVar16 = dVar23 + dVar14;
    if (dVar23 + dVar14 <= local_48) {
      dVar16 = local_48;
    }
    for (; local_48 = dVar16, uVar3 != 3; uVar3 = uVar3 + 1) {
      dVar14 = local_68[uVar3];
      if (dVar14 <= -dVar14) {
        dVar14 = -dVar14;
      }
      dVar14 = (dVar14 + local_48) - local_48;
      if (dVar14 <= -dVar14) {
        dVar14 = -dVar14;
      }
      if (dVar14 < 1e-14) goto LAB_00172669;
      dVar16 = local_48;
    }
    uVar3 = 3;
LAB_00172669:
    uVar1 = uVar6 + 1;
    if (uVar6 != (uVar3 & 0xffffffff)) {
      iVar7 = (int)uVar3;
      uVar4 = 0;
      uVar10 = (ulong)(uint)(iVar7 + iVar5);
      if (iVar7 + iVar5 < 1) {
        uVar10 = uVar4;
      }
      uStack_40 = 0;
      do {
        if ((int)uVar4 == 0x1e) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 200,"ref_matrix_diag_m",1,"not converged");
          return 1;
        }
        dVar23 = (d[uVar1] - dVar18) / (dVar24 + dVar24);
        dVar14 = SQRT(dVar23 * dVar23 + 1.0);
        uVar11 = -(ulong)(0.0 < dVar14);
        if (0.0 <= dVar23) {
          dVar14 = (double)(~uVar11 & (ulong)-dVar14 | (ulong)dVar14 & uVar11);
        }
        else {
          dVar14 = (double)(~uVar11 & (ulong)dVar14 | (ulong)-dVar14 & uVar11);
        }
        local_50 = dVar17;
        dVar17 = dVar24 / (dVar23 + dVar14);
        d[uVar6] = dVar17;
        dVar24 = (dVar23 + dVar14) * dVar24;
        d[uVar1] = dVar24;
        dVar18 = dVar18 - dVar17;
        if (uVar6 == 0) {
          d[2] = d[2] - dVar18;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
        dVar17 = d[uVar3 & 0xffffffff];
        dVar14 = local_68[uVar1];
        uVar11 = 0;
        auVar21 = ZEXT816(0x3ff0000000000000);
        pRVar9 = d + (long)iVar7 * 3 + 3;
        dVar23 = 1.0;
        while( true ) {
          dVar16 = dVar23;
          dVar27 = auVar21._8_8_;
          dVar23 = auVar21._0_8_;
          if (uVar11 == uVar10) break;
          lVar8 = (long)iVar7 - uVar11;
          dVar22 = local_68[lVar8 + -1];
          auVar15._0_8_ = SQRT(dVar17 * dVar17 + dVar22 * dVar22);
          local_68[lVar8] = dVar27 * auVar15._0_8_;
          auVar15._8_8_ = auVar15._0_8_;
          auVar26._8_8_ = dVar22;
          auVar26._0_8_ = dVar17;
          auVar21 = divpd(auVar26,auVar15);
          dVar13 = d[lVar8 + -1];
          dVar25 = auVar21._0_8_;
          dVar28 = auVar21._8_8_;
          d[lVar8] = (dVar23 * dVar22 * dVar25 + dVar13 * dVar28) * dVar28 + dVar17 * dVar23;
          for (lVar8 = -0x18; lVar8 != 0; lVar8 = lVar8 + 8) {
            dVar17 = *(double *)((long)pRVar9 + lVar8 + 0x18);
            *(double *)((long)pRVar9 + lVar8 + 0x18) =
                 dVar28 * *(double *)((long)pRVar9 + lVar8) + dVar25 * dVar17;
            *(double *)((long)pRVar9 + lVar8) =
                 *(double *)((long)pRVar9 + lVar8) * dVar25 + dVar17 * -dVar28;
          }
          dVar17 = dVar13 * dVar25 + -dVar28 * dVar23 * dVar22;
          uVar11 = uVar11 + 1;
          pRVar9 = pRVar9 + -3;
          dVar22 = dVar27;
          dVar13 = dVar16;
        }
        dVar17 = local_50 + dVar18;
        dVar18 = (dVar14 * -dVar27 * dVar22 * dVar13 * local_68[uVar6]) / dVar24;
        dVar24 = dVar27 * dVar18;
        local_68[uVar6] = dVar24;
        dVar18 = dVar23 * dVar18;
        d[uVar6] = dVar18;
        dVar14 = dVar24;
        if (dVar24 <= -dVar24) {
          dVar14 = -dVar24;
        }
        dVar14 = (dVar14 + local_48) - local_48;
        if (dVar14 <= -dVar14) {
          dVar14 = -dVar14;
        }
      } while (1e-14 <= dVar14);
    }
    d[uVar6] = dVar18 + dVar17;
    iVar5 = iVar5 + -1;
    uVar6 = uVar1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m(REF_DBL *m, REF_DBL *d) {
  REF_DBL L, u, v, s;
  REF_DBL e[3];

  REF_DBL f, tst1, tst2;
  REF_INT i, j, l, mm;
  REF_INT l1, l2;
  REF_DBL h, g, p, r, dl1;
  REF_DBL c, c2, c3, el1;
  REF_INT mml, ii, k;
  REF_DBL s2;

  /* potential for stack corruption, if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2]) ||
      !isfinite(m[3]) || !isfinite(m[4]) || !isfinite(m[5])) {
    return REF_INVALID;
  }

  /* one rotation to make tridiagonal ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/EigenSymmetricNxN.pdf */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  L = sqrt(m[1] * m[1] + m[2] * m[2]);

  if (ref_math_divisible(m[1], L) && ref_math_divisible(m[2], L)) {
    u = m[1] / L;
    v = m[2] / L;
    s = 2.0 * u * m[4] + v * (m[5] - m[3]);

    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3] + v * s;
    ref_matrix_eig(d, 2) = m[5] - v * s;

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = u;
    ref_matrix_vec(d, 2, 1) = v;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = v;
    ref_matrix_vec(d, 2, 2) = -u;

    e[0] = L;
    e[1] = m[4] - u * s;
    e[2] = 0.0;
  } else {
    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3];
    ref_matrix_eig(d, 2) = m[5];

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = 1.0;
    ref_matrix_vec(d, 2, 1) = 0.0;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;

    e[0] = m[1];
    e[1] = m[4];
    e[2] = 0.0;
  }

  c3 = 0;
  s2 = 0; /* quiet -Wall used without set compiler warning */

  f = 0.0;
  tst1 = 0.0;
  e[2] = 0.0;

#define gridSign(a, b) (b >= 0 ? ABS(a) : -ABS(a))

  for (l = 0; l < 3; l++) { /* row_loop  */
    j = 0;
    h = ABS(d[l]) + ABS(e[l]);
    if (tst1 < h) tst1 = h;
    /* look for small sub-diagonal element */
    for (mm = l; mm < 3; mm++) { /*test_for_zero_e */
      tst2 = tst1 + ABS(e[mm]);
      if (ABS(tst2 - tst1) < 1.0e-14) break;
      /* e[2] is always zero, so there is no exit through the bottom of loop*/
    }
    if (mm != l) { /* l_not_equal_mm */
      do {
        j = j + 1;
        /* set error -- no convergence to an eigenvalue after 30 iterations */
        if (j > 30) {
          RSS(REF_FAILURE, "not converged");
        }
        /* form shift */
        l1 = l + 1;
        l2 = l1 + 1;
        g = d[l];
        p = (d[l1] - g) / (2.0 * e[l]);
        r = sqrt(p * p + 1.0);
        d[l] = e[l] / (p + gridSign(r, p));
        d[l1] = e[l] * (p + gridSign(r, p));
        dl1 = d[l1];
        h = g - d[l];
        if (l2 <= 2) {
          for (i = l2; i < 3; i++) {
            d[i] = d[i] - h;
          }
        }
        f = f + h;
        /* ql transformation */
        p = d[mm];
        c = 1.0;
        c2 = c;
        el1 = e[l1];
        s = 0.0;
        mml = mm - l;
        for (ii = 0; ii < mml; ii++) {
          c3 = c2;
          c2 = c;
          s2 = s;
          i = mm - ii - 1;
          g = c * e[i];
          h = c * p;
          r = sqrt(p * p + e[i] * e[i]);
          e[i + 1] = s * r;
          s = e[i] / r;
          c = p / r;
          p = c * d[i] - s * g;
          d[i + 1] = h + s * (c * g + s * d[i]);
          /* form vector */
          for (k = 0; k < 3; k++) {
            h = ref_matrix_vec(d, k, i + 1);
            ref_matrix_vec(d, k, i + 1) = s * ref_matrix_vec(d, k, i) + c * h;
            ref_matrix_vec(d, k, i) = c * ref_matrix_vec(d, k, i) - s * h;
          }
        }
        p = -s * s2 * c3 * el1 * e[l] / dl1;
        e[l] = s * p;
        d[l] = c * p;
        tst2 = tst1 + ABS(e[l]);
        if (ABS(tst2 - tst1) < 1.0e-14) break;
      } while (REF_TRUE); /* iterate */
    }                     /* l_not_equal_mm */
    d[l] = d[l] + f;
  } /* row_loop */

  return REF_SUCCESS;
}